

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void write_dec_ref_base_pic_marking(nal_t *nal,bs_t *b)

{
  bs_t *b_local;
  nal_t *nal_local;
  
  bs_write_u1(b,(uint)(nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag & 1));
  if ((nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag & 1U) != 0) {
    do {
      bs_write_ue(b,nal->prefix_nal_svc->memory_management_base_control_operation);
      if (nal->prefix_nal_svc->memory_management_base_control_operation == 1) {
        bs_write_ue(b,nal->prefix_nal_svc->difference_of_base_pic_nums_minus1);
      }
      if (nal->prefix_nal_svc->memory_management_base_control_operation == 2) {
        bs_write_ue(b,nal->prefix_nal_svc->long_term_base_pic_num);
      }
    } while (nal->prefix_nal_svc->memory_management_base_control_operation != 0);
  }
  return;
}

Assistant:

void write_dec_ref_base_pic_marking(nal_t* nal, bs_t* b)
{
    bs_write_u1(b, nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag);
    if( nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag )
    {
        do {
            bs_write_ue(b, nal->prefix_nal_svc->memory_management_base_control_operation);
            
            if( nal->prefix_nal_svc->memory_management_base_control_operation == 1 )
            {
                bs_write_ue(b, nal->prefix_nal_svc->difference_of_base_pic_nums_minus1);
            }
            if( nal->prefix_nal_svc->memory_management_base_control_operation == 2 )
            {
                bs_write_ue(b, nal->prefix_nal_svc->long_term_base_pic_num);
            }
        } while( nal->prefix_nal_svc->memory_management_base_control_operation != 0 );
    }
}